

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManDupUnshuffleInputs(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int nPis;
  int nAll;
  int nCIs;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0xd0,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  iVar1 = Gia_ManIsSeqWithBoxes(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsSeqWithBoxes(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0xd1,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  iVar2 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
  iVar3 = Gia_ManRegNum(p);
  iVar1 = iVar1 - iVar3;
  iVar3 = Gia_ManCiNum(p);
  if (iVar2 != iVar3) {
    __assert_fail("nAll == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0xdd,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  if (iVar1 < 1) {
    __assert_fail("nPis > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0xde,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  for (nAll = 0; nAll < iVar1; nAll = nAll + 1) {
    uVar4 = Gia_ManAppendCi(p_00);
    pGVar6 = Gia_ManCi(p,nAll);
    pGVar6->Value = uVar4;
  }
  iVar3 = Gia_ManRegNum(p);
  for (nAll = iVar2 - iVar3; nAll < iVar2; nAll = nAll + 1) {
    uVar4 = Gia_ManAppendCi(p_00);
    pGVar6 = Gia_ManCi(p,nAll);
    pGVar6->Value = uVar4;
  }
  while (nAll = iVar1, iVar1 = Gia_ManRegNum(p), nAll < iVar2 - iVar1) {
    uVar4 = Gia_ManAppendCi(p_00);
    pGVar6 = Gia_ManCi(p,nAll);
    pGVar6->Value = uVar4;
    iVar1 = nAll + 1;
  }
  printf("Warning: Unshuffled CI order to be correct AIG with boxes.\n");
  nAll = 0;
  while( true ) {
    bVar7 = false;
    if (nAll < p->nObjs) {
      _nCIs = Gia_ManObj(p,nAll);
      bVar7 = _nCIs != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_nCIs);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_nCIs);
      iVar2 = Gia_ObjFanin1Copy(_nCIs);
      uVar4 = Gia_ManAppendAnd(p_00,iVar1,iVar2);
      _nCIs->Value = uVar4;
    }
    nAll = nAll + 1;
  }
  nAll = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (nAll < iVar1) {
      _nCIs = Gia_ManCo(p,nAll);
      bVar7 = _nCIs != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_nCIs);
    uVar4 = Gia_ManAppendCo(p_00,iVar1);
    _nCIs->Value = uVar4;
    nAll = nAll + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  p_00->nConstrs = p->nConstrs;
  iVar1 = Gia_ManIsNormalized(p_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0xf0,"Gia_Man_t *Gia_ManDupUnshuffleInputs(Gia_Man_t *)");
  }
  Gia_ManDupRemapEquiv(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupUnshuffleInputs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nCIs, nAll, nPis;
    // sanity checks
    assert( Gia_ManIsNormalized(p) );
    assert( Gia_ManIsSeqWithBoxes(p) );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    // change input order
    // desired reorder:   PIs + NewCIs + FOs
    // current CI order:  PIs + FOs + NewCIs
    nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
    nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
    nPis = nCIs - Gia_ManRegNum(p);
    assert( nAll == Gia_ManCiNum(p) );
    assert( nPis > 0 );
    // copy PIs first
    for ( i = 0; i < nPis; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy flops second
    for ( i = nAll - Gia_ManRegNum(p); i < nAll; i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    // copy new CIs last
    for ( i = nPis; i < nAll - Gia_ManRegNum(p); i++ )
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
    printf( "Warning: Unshuffled CI order to be correct AIG with boxes.\n" );
    // other things
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}